

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.h
# Opt level: O2

OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> * __thiscall
Js::ByteCodeReader::GetLayout<Js::OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
          (ByteCodeReader *this)

{
  OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *pOVar1;
  OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *pOVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  pOVar2 = (OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *)this->m_currentLocation;
  pOVar1 = pOVar2 + 1;
  this->m_currentLocation = &pOVar1->Arg;
  if ((OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *)this->m_endLocation < pOVar1)
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/ByteCode/ByteCodeReader.h"
                                ,0x68,"(m_currentLocation <= m_endLocation)",
                                "m_currentLocation <= m_endLocation");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  return pOVar2;
}

Assistant:

inline const unaligned LayoutType * ByteCodeReader::GetLayout()
    {
        size_t layoutSize = sizeof(LayoutType);

        AssertMsg((layoutSize > 0) && (layoutSize < 100), "Ensure valid layout size");

        const byte * layoutData = m_currentLocation;
        m_currentLocation += layoutSize;

        Assert(m_currentLocation <= m_endLocation);

        return reinterpret_cast<const unaligned LayoutType *>(layoutData);
    }